

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.cpp
# Opt level: O2

void __thiscall
booster::streambuf::device
          (streambuf *this,
          unique_ptr<booster::io_device,_std::default_delete<booster::io_device>_> *d)

{
  reset_device(this);
  std::__uniq_ptr_impl<booster::io_device,_std::default_delete<booster::io_device>_>::operator=
            ((__uniq_ptr_impl<booster::io_device,_std::default_delete<booster::io_device>_> *)
             &this->device_unique_ptr_,
             (__uniq_ptr_impl<booster::io_device,_std::default_delete<booster::io_device>_> *)d);
  this->device_ =
       (this->device_unique_ptr_)._M_t.
       super___uniq_ptr_impl<booster::io_device,_std::default_delete<booster::io_device>_>._M_t.
       super__Tuple_impl<0UL,_booster::io_device_*,_std::default_delete<booster::io_device>_>.
       super__Head_base<0UL,_booster::io_device_*,_false>._M_head_impl;
  return;
}

Assistant:

void streambuf::device(std::unique_ptr<io_device> d)
	{
		reset_device();
		device_unique_ptr_=std::move(d);
		device_ = device_unique_ptr_.get();
	}